

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_count_shift.hpp
# Opt level: O3

void __thiscall trng::lcg64_count_shift::jump2(lcg64_count_shift *this,uint s)

{
  result_type rVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  result_type rVar10;
  result_type rVar11;
  long lVar12;
  ulong uVar13;
  
  rVar1 = (this->P).a;
  uVar3 = 1L << ((byte)s & 0x3f);
  lVar6 = 1;
  rVar10 = rVar1;
  uVar7 = uVar3;
  do {
    rVar11 = rVar10;
    if ((uVar7 & 1) == 0) {
      rVar11 = 1;
    }
    lVar6 = lVar6 * rVar11;
    rVar10 = rVar10 * rVar10;
    bVar2 = 1 < uVar7;
    uVar7 = uVar7 >> 1;
  } while (bVar2);
  uVar7 = uVar3 >> 1;
  if (uVar7 == 0) {
    uVar8 = 0x40;
  }
  else {
    uVar8 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = uVar8 ^ 0x3f;
  }
  uVar7 = 0;
  lVar9 = 0;
  rVar10 = rVar1;
  do {
    if ((uVar3 >> (uVar7 & 0x3f) & 1) != 0) {
      lVar12 = 1;
      rVar11 = rVar1;
      for (uVar13 = uVar7; uVar13 != 0; uVar13 = uVar13 - 1) {
        lVar12 = lVar12 * (rVar11 + 1);
        rVar11 = rVar11 * rVar11;
      }
      lVar9 = lVar9 * rVar10 + lVar12;
    }
    rVar10 = rVar10 * rVar10;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x41 - uVar8);
  (this->S).r = lVar9 * (this->P).b + lVar6 * (this->S).r;
  if (s == 0) {
    uVar7 = 1;
  }
  else {
    uVar4 = 2;
    if (2 < s + 1) {
      uVar4 = s + 1;
    }
    uVar5 = 1;
    uVar3 = 1;
    do {
      if (uVar3 == 0) {
        uVar7 = 0;
      }
      else {
        uVar8 = 2;
        if (uVar3 < 2) {
          uVar8 = uVar3;
        }
        if (uVar3 < 3) {
          uVar3 = 2;
        }
        uVar7 = 0;
        do {
          uVar13 = uVar7 + uVar3;
          if (0x1ffffffffffffffe < uVar13) {
            uVar13 = uVar13 + 0xe000000000000001;
          }
          if ((uVar8 & 1) != 0) {
            uVar7 = uVar13;
          }
          uVar13 = uVar3 * 2;
          uVar3 = uVar3 * 2 + 0xe000000000000001;
          if (uVar13 < 0x1fffffffffffffff) {
            uVar3 = uVar13;
          }
          bVar2 = 1 < uVar8;
          uVar8 = uVar8 >> 1;
        } while (bVar2);
      }
      uVar5 = uVar5 + 1;
      uVar3 = uVar7;
    } while (uVar5 != uVar4);
  }
  uVar3 = (this->P).inc;
  uVar8 = uVar3;
  if (uVar7 < uVar3) {
    uVar8 = uVar7;
  }
  if (uVar8 == 0) {
    uVar7 = 0;
  }
  else {
    if (uVar3 < uVar7) {
      uVar3 = uVar7;
    }
    uVar7 = 0;
    do {
      uVar13 = uVar7 + uVar3;
      if (0x1ffffffffffffffe < uVar13) {
        uVar13 = uVar13 + 0xe000000000000001;
      }
      if ((uVar8 & 1) != 0) {
        uVar7 = uVar13;
      }
      uVar13 = uVar3 * 2;
      uVar3 = uVar3 * 2 + 0xe000000000000001;
      if (uVar13 < 0x1fffffffffffffff) {
        uVar3 = uVar13;
      }
      bVar2 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
    } while (bVar2);
  }
  uVar7 = uVar7 + (this->S).count;
  uVar3 = uVar7 + 0xe000000000000001;
  if (uVar7 < 0x1fffffffffffffff) {
    uVar3 = uVar7;
  }
  (this->S).count = uVar3;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64_count_shift::jump2(unsigned int s) {
    // LCG part
    S.r = S.r * pow(P.a, 1ull << s) + f(1ull << s, P.a) * P.b;
    // counting part
    result_type powers_of_2{1};
    for (unsigned int i{1}; i <= s; ++i)
      powers_of_2 = mult_modulo(2, powers_of_2);
    S.count += mult_modulo(powers_of_2, P.inc);
    if (S.count >= modulus)
      S.count -= modulus;
  }